

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O0

int Mio_GateParseFormula(Mio_Gate_t *pGate)

{
  Mio_Pin_t *pPin_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  Mio_Pin_t *pMVar5;
  word wVar6;
  word *pwVar7;
  int local_674;
  int local_670;
  int i;
  int iPin;
  int nPins;
  Mio_Pin_t **ppPin;
  Mio_Pin_t *pPin;
  char *pPinNamesCopy [100];
  char *pPinNames [100];
  Mio_Gate_t *pGate_local;
  
  pGate->dDelayMax = 0.0;
  i = 0;
  for (ppPin = (Mio_Pin_t **)Mio_GateReadPins(pGate); ppPin != (Mio_Pin_t **)0x0;
      ppPin = (Mio_Pin_t **)Mio_PinReadNext((Mio_Pin_t *)ppPin)) {
    if (pGate->dDelayMax < (double)ppPin[8]) {
      pGate->dDelayMax = (double)ppPin[8];
    }
    i = i + 1;
  }
  if (i == 0) {
    iVar1 = strcmp(pGate->pForm,"CONST0");
    if (iVar1 == 0) {
      pVVar3 = Exp_Const0();
      pGate->vExpr = pVVar3;
      pcVar4 = Mio_SopRegister(pGate->pLib->pMmFlex," 0\n");
      pGate->pSop = pcVar4;
      (pGate->field_15).uTruth = 0;
      pGate->pLib->pGate0 = pGate;
    }
    else {
      iVar1 = strcmp(pGate->pForm,"CONST1");
      if (iVar1 != 0) {
        printf("Cannot parse formula \"%s\" of gate \"%s\".\n",pGate->pForm,pGate->pName);
        return 1;
      }
      pVVar3 = Exp_Const1();
      pGate->vExpr = pVVar3;
      pcVar4 = Mio_SopRegister(pGate->pLib->pMmFlex," 1\n");
      pGate->pSop = pcVar4;
      (pGate->field_15).uTruth = 0xffffffffffffffff;
      pGate->pLib->pGate1 = pGate;
    }
    pGate_local._4_4_ = 0;
  }
  else {
    iVar1 = Mio_GateCollectNames(pGate->pForm,pPinNamesCopy + 99);
    if (iVar1 == 0) {
      printf("Cannot read formula \"%s\" of gate \"%s\".\n",pGate->pForm,pGate->pName);
      pGate_local._4_4_ = 1;
    }
    else {
      pGate->nInputs = iVar1;
      iVar2 = strcmp(pGate->pPins->pName,"*");
      if (iVar2 == 0) {
        pPin_00 = pGate->pPins;
        if (pPin_00->pName != (char *)0x0) {
          free(pPin_00->pName);
          pPin_00->pName = (char *)0x0;
        }
        pMVar5 = pPin_00;
        for (local_674 = 1; _iPin = &pMVar5->pNext, local_674 < iVar1; local_674 = local_674 + 1) {
          pMVar5 = Mio_PinDup(pPin_00);
          *_iPin = pMVar5;
          (*_iPin)->pName = pPinNamesCopy[(long)local_674 + 99];
          pMVar5 = *_iPin;
        }
        *_iPin = (Mio_Pin_t *)0x0;
        pPin_00->pName = pPinNamesCopy[99];
      }
      else {
        local_670 = 0;
        for (ppPin = (Mio_Pin_t **)Mio_GateReadPins(pGate); ppPin != (Mio_Pin_t **)0x0;
            ppPin = (Mio_Pin_t **)Mio_PinReadNext((Mio_Pin_t *)ppPin)) {
          for (local_674 = 0; local_674 < iVar1; local_674 = local_674 + 1) {
            if ((pPinNamesCopy[(long)local_674 + 99] != (char *)0x0) &&
               (iVar2 = strcmp(pPinNamesCopy[(long)local_674 + 99],(char *)*ppPin), iVar2 == 0)) {
              if (pPinNamesCopy[(long)local_674 + 99] != (char *)0x0) {
                free(pPinNamesCopy[(long)local_674 + 99]);
                pPinNamesCopy[(long)local_674 + 99] = (char *)0x0;
              }
              pPinNamesCopy[(long)local_670 + -1] = (char *)*ppPin;
              local_670 = local_670 + 1;
              break;
            }
            if (local_674 == iVar1) {
              printf("Cannot find pin name \"%s\" in the formula \"%s\" of gate \"%s\".\n",*ppPin,
                     pGate->pForm,pGate->pName);
              return 1;
            }
          }
        }
        for (local_674 = 0; local_674 < iVar1; local_674 = local_674 + 1) {
          if (pPinNamesCopy[(long)local_674 + 99] != (char *)0x0) {
            printf("Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n"
                   ,pPinNamesCopy[(long)local_674 + 99],pGate->pForm,pGate->pName);
            return 1;
          }
        }
        memcpy(pPinNamesCopy + 99,&pPin,(long)iVar1 << 3);
      }
      pVVar3 = Mio_ParseFormula(pGate->pForm,pPinNamesCopy + 99,iVar1);
      pGate->vExpr = pVVar3;
      pcVar4 = Mio_LibDeriveSop(iVar1,pGate->vExpr,pGate->pLib->vCube);
      pGate->pSop = pcVar4;
      pcVar4 = Mio_SopRegister(pGate->pLib->pMmFlex,pGate->pSop);
      pGate->pSop = pcVar4;
      if (iVar1 < 7) {
        wVar6 = Exp_Truth6(iVar1,pGate->vExpr,(word *)0x0);
        (pGate->field_15).uTruth = wVar6;
      }
      else if (iVar1 < 9) {
        pwVar7 = (word *)calloc(4,8);
        (pGate->field_15).pTruth = pwVar7;
        Exp_Truth8(iVar1,pGate->vExpr,(word **)0x0,(pGate->field_15).pTruth);
      }
      pGate_local._4_4_ = 0;
    }
  }
  return pGate_local._4_4_;
}

Assistant:

int Mio_GateParseFormula( Mio_Gate_t * pGate )
{
    char * pPinNames[100];
    char * pPinNamesCopy[100];
    Mio_Pin_t * pPin, ** ppPin;
    int nPins, iPin, i;

    // set the maximum delay of the gate; count pins
    pGate->dDelayMax = 0.0;
    nPins = 0;
    Mio_GateForEachPin( pGate, pPin )
    {
        // set the maximum delay of the gate
        if ( pGate->dDelayMax < pPin->dDelayBlockMax )
            pGate->dDelayMax = pPin->dDelayBlockMax;
        // count the pin
        nPins++;
    }

    // check for the gate with const function
    if ( nPins == 0 )
    {
        if ( strcmp( pGate->pForm, MIO_STRING_CONST0 ) == 0 )
        {
//            pGate->bFunc = b0;
            pGate->vExpr = Exp_Const0();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 0\n" );
            pGate->uTruth = 0;
            pGate->pLib->pGate0 = pGate;
        }
        else if ( strcmp( pGate->pForm, MIO_STRING_CONST1 ) == 0 )
        {
//            pGate->bFunc = b1;
            pGate->vExpr = Exp_Const1();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 1\n" );
            pGate->uTruth = ~(word)0;
            pGate->pLib->pGate1 = pGate;
        }
        else
        {
            printf( "Cannot parse formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
            return 1;
        }
//        Cudd_Ref( pGate->bFunc );
        return 0;
    }

    // collect the names as they appear in the formula
    nPins = Mio_GateCollectNames( pGate->pForm, pPinNames );
    if ( nPins == 0 )
    {
        printf( "Cannot read formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
        return 1;
    }

    // set the number of inputs
    pGate->nInputs = nPins;

    // consider the case when all the pins have identical pin info
    if ( strcmp( pGate->pPins->pName, "*" ) == 0 )
    {
        // get the topmost (generic) pin
        pPin = pGate->pPins;
        ABC_FREE( pPin->pName );

        // create individual pins from the generic pin
        ppPin = &pPin->pNext;
        for ( i = 1; i < nPins; i++ )
        {
            // get the new pin
            *ppPin = Mio_PinDup( pPin );
            // set its name
            (*ppPin)->pName = pPinNames[i];
            // prepare the next place in the list
            ppPin = &((*ppPin)->pNext);
        }
        *ppPin = NULL;

        // set the name of the topmost pin
        pPin->pName = pPinNames[0];
    }
    else
    {
        // reorder the variable names to appear the save way as the pins
        iPin = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            // find the pin with the name pPin->pName
            for ( i = 0; i < nPins; i++ )
            {
                if ( pPinNames[i] && strcmp( pPinNames[i], pPin->pName ) == 0 )
                {
                    // free pPinNames[i] because it is already available as pPin->pName
                    // setting pPinNames[i] to NULL is useful to make sure that
                    // this name is not assigned to two pins in the list
                    ABC_FREE( pPinNames[i] );
                    pPinNamesCopy[iPin++] = pPin->pName;
                    break;
                }
                if ( i == nPins )
                {
                    printf( "Cannot find pin name \"%s\" in the formula \"%s\" of gate \"%s\".\n", 
                        pPin->pName, pGate->pForm, pGate->pName );
                    return 1;
                }
            }
        }

        // check for the remaining names
        for ( i = 0; i < nPins; i++ )
            if ( pPinNames[i] )
            {
                printf( "Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n", 
                    pPinNames[i], pGate->pForm, pGate->pName );
                return 1;
            }

        // copy the names back
        memcpy( pPinNames, pPinNamesCopy, nPins * sizeof(char *) );
    }
/*
    // expand the manager if necessary
    if ( dd->size < nPins )
    {
        Cudd_Quit( dd );
        dd = Cudd_Init( nPins + 10, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_zddVarsFromBddVars( dd, 2 );
    }
    // derive formula as the BDD
    pGate->bFunc = Parse_FormulaParser( stdout, pGate->pForm, nPins, 0, pPinNames, dd, dd->vars );
    if ( pGate->bFunc == NULL )
        return 1;
    Cudd_Ref( pGate->bFunc );
    // derive cover
    pGate->pSop = Abc_ConvertBddToSop( pGate->pLib->pMmFlex, dd, pGate->bFunc, pGate->bFunc, nPins, 0, pGate->pLib->vCube, -1 );
*/

    // derive expression 
    pGate->vExpr = Mio_ParseFormula( pGate->pForm, (char **)pPinNames, nPins );
//    Mio_ParseFormulaTruthTest( pGate->pForm, (char **)pPinNames, nPins );
    // derive cover
    pGate->pSop = Mio_LibDeriveSop( nPins, pGate->vExpr, pGate->pLib->vCube );
    pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, pGate->pSop );
    // derive truth table
    if ( nPins <= 6 )
        pGate->uTruth = Exp_Truth6( nPins, pGate->vExpr, NULL );
    else if ( nPins <= 8 )
    {
        pGate->pTruth = ABC_CALLOC( word, 4 );
        Exp_Truth8( nPins, pGate->vExpr, NULL, pGate->pTruth );
    }

/*
    // verify
    if ( pGate->nInputs <= 6 )
    {
        extern word Abc_SopToTruth( char * pSop, int nInputs );
        word t2 = Abc_SopToTruth( pGate->pSop, nPins );
        if ( pGate->uTruth != t2 )
        {
            printf( "%s\n", pGate->pForm );
            Exp_Print( nPins, pGate->vExpr );
            printf( "Verification failed!\n" );
        }
    }
*/
    return 0;
}